

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_mapstore.c
# Opt level: O0

int resize_impl(dds_mapstore *store,int new_length)

{
  dds_bucket_id_mapping *bid_mapping;
  size_t sVar1;
  double gamma;
  int local_20;
  int num_bucks;
  int new_length_local;
  dds_mapstore *store_local;
  
  if (((store->resizable & 1U) == 0) || (store->store_type == UNBOUNDED_MAPSTORE)) {
    sVar1 = (*store->buckets->_vtable->count)(store->buckets->_object);
    store_local._4_4_ = (int)sVar1;
  }
  else {
    sVar1 = (*store->buckets->_vtable->count)(store->buckets->_object);
    local_20 = (int)sVar1;
    while (new_length < local_20) {
      dds_mapstore_collapse(store);
      if (store->store_type == COLLAPSINGALL_MAPSTORE) {
        bid_mapping = store->id_mapping;
        gamma = pow(store->id_mapping->gamma_value,2.0);
        dds_bucket_id_mapping_update(bid_mapping,gamma);
      }
      sVar1 = (*store->buckets->_vtable->count)(store->buckets->_object);
      local_20 = (int)sVar1;
    }
    store_local._4_4_ = local_20;
  }
  return store_local._4_4_;
}

Assistant:

static int resize_impl(struct dds_mapstore *store, int new_length) {
    if (!store->resizable || store->store_type == UNBOUNDED_MAPSTORE) {
        return dict_count(store->buckets);
    }
    int num_bucks = dict_count(store->buckets);
    while (num_bucks > new_length) {
        dds_mapstore_collapse(store);
        if (store->store_type == COLLAPSINGALL_MAPSTORE)
            dds_bucket_id_mapping_update(store->id_mapping, pow(store->id_mapping->gamma_value,2.0));
        num_bucks = dict_count(store->buckets);
    }
    return num_bucks;
}